

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::BlindRawTransactionRequest,cfd::js::api::json::BlindTransactionResponse,cfd::js::api::BlindRawTransactionRequestStruct,cfd::js::api::BlindTransactionResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::BlindTransactionResponseStruct_(const_cfd::js::api::BlindRawTransactionRequestStruct_&)>
          *call_function)

{
  ErrorResponse local_650;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_598 [4];
  JsonClassBase<cfd::js::api::json::BlindTransactionResponse> local_578 [4];
  undefined1 local_558 [8];
  BlindTransactionResponse res_2;
  undefined1 local_4b8 [8];
  BlindTransactionResponseStruct response;
  BlindRawTransactionRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_110 [8];
  BlindRawTransactionRequest req;
  function<cfd::js::api::BlindTransactionResponseStruct_(const_cfd::js::api::BlindRawTransactionRequestStruct_&)>
  *call_function_local;
  string *request_message_local;
  string *json_message;
  
  req._232_8_ = call_function;
  BlindRawTransactionRequest::BlindRawTransactionRequest((BlindRawTransactionRequest *)local_110);
  core::JsonClassBase<cfd::js::api::json::BlindRawTransactionRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::BlindRawTransactionRequest> *)local_110,
             request_message);
  BlindRawTransactionRequest::ConvertToStruct
            ((BlindRawTransactionRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (BlindRawTransactionRequest *)local_110);
  std::
  function<cfd::js::api::BlindTransactionResponseStruct_(const_cfd::js::api::BlindRawTransactionRequestStruct_&)>
  ::operator()((BlindTransactionResponseStruct *)local_4b8,call_function,
               (BlindRawTransactionRequestStruct *)
               &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  res_2.issuance_blinders_.super_JsonVector<cfd::js::api::json::UnblindIssuanceOutput>.
  super_vector<cfd::js::api::json::UnblindIssuanceOutput,_std::allocator<cfd::js::api::json::UnblindIssuanceOutput>_>
  .
  super__Vector_base<cfd::js::api::json::UnblindIssuanceOutput,_std::allocator<cfd::js::api::json::UnblindIssuanceOutput>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if ((int)response.issuance_blinders.
           super__Vector_base<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
    BlindTransactionResponse::BlindTransactionResponse((BlindTransactionResponse *)local_558);
    BlindTransactionResponse::ConvertFromStruct
              ((BlindTransactionResponse *)local_558,(BlindTransactionResponseStruct *)local_4b8);
    core::JsonClassBase<cfd::js::api::json::BlindTransactionResponse>::Serialize_abi_cxx11_
              (local_578);
    std::__cxx11::string::operator=((string *)this,(string *)local_578);
    std::__cxx11::string::~string((string *)local_578);
    BlindTransactionResponse::~BlindTransactionResponse((BlindTransactionResponse *)local_558);
  }
  else {
    ErrorResponse::ConvertFromStruct
              (&local_650,
               (InnerErrorResponseStruct *)
               &response.issuance_blinders.
                super__Vector_base<cfd::js::api::UnblindIssuanceOutputStruct,_std::allocator<cfd::js::api::UnblindIssuanceOutputStruct>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_598);
    std::__cxx11::string::operator=((string *)this,(string *)local_598);
    std::__cxx11::string::~string((string *)local_598);
    ErrorResponse::~ErrorResponse(&local_650);
  }
  res_2.issuance_blinders_.super_JsonVector<cfd::js::api::json::UnblindIssuanceOutput>.
  super_vector<cfd::js::api::json::UnblindIssuanceOutput,_std::allocator<cfd::js::api::json::UnblindIssuanceOutput>_>
  .
  super__Vector_base<cfd::js::api::json::UnblindIssuanceOutput,_std::allocator<cfd::js::api::json::UnblindIssuanceOutput>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  BlindTransactionResponseStruct::~BlindTransactionResponseStruct
            ((BlindTransactionResponseStruct *)local_4b8);
  BlindRawTransactionRequestStruct::~BlindRawTransactionRequestStruct
            ((BlindRawTransactionRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  BlindRawTransactionRequest::~BlindRawTransactionRequest((BlindRawTransactionRequest *)local_110);
  return this;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}